

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicAPIBind::Run(BasicAPIBind *this)

{
  CallLogWrapper *this_00;
  GLuint *pGVar1;
  bool bVar2;
  GLuint GVar3;
  long lVar4;
  uint uVar5;
  GLint name;
  GLuint *local_38;
  
  uVar5 = 0;
  bVar2 = ShaderImageLoadStoreBase::CheckBinding
                    (&this->super_ShaderImageLoadStoreBase,0,0,0,'\0',0,35000,0x8229);
  if (bVar2) {
    GVar3 = 1;
    do {
      if (uVar5 == 0xfffffff9) goto LAB_009a0e61;
      bVar2 = ShaderImageLoadStoreBase::CheckBinding
                        (&this->super_ShaderImageLoadStoreBase,GVar3,0,0,'\0',0,35000,0x8229);
      uVar5 = uVar5 - 1;
      GVar3 = GVar3 + 1;
    } while (bVar2);
    anon_unknown_0::Output("Binding point %d has invalid default state.\n",(ulong)-uVar5);
    lVar4 = -1;
    if (uVar5 < 0xfffffff9) {
LAB_009a0e61:
      this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                 super_CallLogWrapper;
      local_38 = &this->m_texture;
      glu::CallLogWrapper::glGenTextures(this_00,1,local_38);
      glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,this->m_texture);
      glu::CallLogWrapper::glTexImage3D
                (this_00,0x8c1a,0,0x822e,0x10,0x10,4,0,0x1903,0x1406,(void *)0x0);
      glu::CallLogWrapper::glTexImage3D(this_00,0x8c1a,1,0x822e,8,8,4,0,0x1903,0x1406,(void *)0x0);
      glu::CallLogWrapper::glTexImage3D(this_00,0x8c1a,2,0x822e,4,4,4,0,0x1903,0x1406,(void *)0x0);
      glu::CallLogWrapper::glTexImage3D(this_00,0x8c1a,3,0x822e,2,2,4,0,0x1903,0x1406,(void *)0x0);
      glu::CallLogWrapper::glTexImage3D(this_00,0x8c1a,4,0x822e,1,1,4,0,0x1903,0x1406,(void *)0x0);
      glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
      glu::CallLogWrapper::glBindImageTexture(this_00,0,this->m_texture,0,'\0',0,0x88ba,0x822e);
      bVar2 = ShaderImageLoadStoreBase::CheckBinding
                        (&this->super_ShaderImageLoadStoreBase,0,this->m_texture,0,'\0',0,0x88ba,
                         0x822e);
      lVar4 = -1;
      if (bVar2) {
        glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture,1,'\x01',1,0x88b9,0x8058);
        bVar2 = ShaderImageLoadStoreBase::CheckBinding
                          (&this->super_ShaderImageLoadStoreBase,1,this->m_texture,1,'\x01',1,0x88b9
                           ,0x8058);
        if (bVar2) {
          glu::CallLogWrapper::glBindImageTexture(this_00,4,this->m_texture,3,'\0',2,35000,0x822c);
          bVar2 = ShaderImageLoadStoreBase::CheckBinding
                            (&this->super_ShaderImageLoadStoreBase,4,this->m_texture,3,'\0',2,35000,
                             0x822c);
          if (bVar2) {
            uVar5 = 0;
            glu::CallLogWrapper::glBindImageTexture(this_00,7,this->m_texture,4,'\0',3,35000,0x8235)
            ;
            bVar2 = ShaderImageLoadStoreBase::CheckBinding
                              (&this->super_ShaderImageLoadStoreBase,7,this->m_texture,4,'\0',3,
                               35000,0x8235);
            pGVar1 = local_38;
            if (bVar2) {
              GVar3 = 1;
              glu::CallLogWrapper::glDeleteTextures(this_00,1,local_38);
              *pGVar1 = 0;
              glu::CallLogWrapper::glGetIntegeri_v(this_00,0x8f3a,0,&name);
              bVar2 = true;
              if (name == 0) {
                uVar5 = 0;
                do {
                  if (uVar5 == 0xfffffff9) {
                    bVar2 = false;
                    goto LAB_009a1199;
                  }
                  glu::CallLogWrapper::glGetIntegeri_v(this_00,0x8f3a,GVar3,&name);
                  uVar5 = uVar5 - 1;
                  GVar3 = GVar3 + 1;
                } while (name == 0);
                bVar2 = 0xfffffff8 < uVar5;
                uVar5 = -uVar5;
              }
              anon_unknown_0::Output
                        ("Binding point %d should be set to 0 after texture deletion.\n",
                         (ulong)uVar5);
LAB_009a1199:
              lVar4 = -(ulong)bVar2;
            }
          }
        }
      }
    }
  }
  else {
    anon_unknown_0::Output("Binding point %d has invalid default state.\n",0);
    lVar4 = -1;
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{
		for (GLuint index = 0; index < 8; ++index)
		{
			if (!CheckBinding(index, 0, 0, GL_FALSE, 0, GL_READ_ONLY, GL_R8))
			{
				Output("Binding point %d has invalid default state.\n", index);
				return ERROR;
			}
		}

		glGenTextures(1, &m_texture);
		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_R32F, 16, 16, 4, 0, GL_RED, GL_FLOAT, NULL);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 1, GL_R32F, 8, 8, 4, 0, GL_RED, GL_FLOAT, NULL);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 2, GL_R32F, 4, 4, 4, 0, GL_RED, GL_FLOAT, NULL);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 3, GL_R32F, 2, 2, 4, 0, GL_RED, GL_FLOAT, NULL);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 4, GL_R32F, 1, 1, 4, 0, GL_RED, GL_FLOAT, NULL);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32F);
		if (!CheckBinding(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32F))
			return ERROR;

		glBindImageTexture(1, m_texture, 1, GL_TRUE, 1, GL_WRITE_ONLY, GL_RGBA8);
		if (!CheckBinding(1, m_texture, 1, GL_TRUE, 1, GL_WRITE_ONLY, GL_RGBA8))
			return ERROR;

		glBindImageTexture(4, m_texture, 3, GL_FALSE, 2, GL_READ_ONLY, GL_RG16);
		if (!CheckBinding(4, m_texture, 3, GL_FALSE, 2, GL_READ_ONLY, GL_RG16))
			return ERROR;

		glBindImageTexture(7, m_texture, 4, GL_FALSE, 3, GL_READ_ONLY, GL_R32I);
		if (!CheckBinding(7, m_texture, 4, GL_FALSE, 3, GL_READ_ONLY, GL_R32I))
			return ERROR;

		glDeleteTextures(1, &m_texture);
		m_texture = 0;

		for (GLuint index = 0; index < 8; ++index)
		{
			GLint name;
			glGetIntegeri_v(GL_IMAGE_BINDING_NAME, index, &name);
			if (name != 0)
			{
				Output("Binding point %d should be set to 0 after texture deletion.\n", index);
				return ERROR;
			}
		}

		return NO_ERROR;
	}